

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferedOutputStreamTest.cpp
# Opt level: O0

int BufferedOutputStreamTest(int argc,char **argv)

{
  IByteWriter *argv_00;
  OutputBufferedStream *this;
  OutputFileStream *this_00;
  undefined4 local_78;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  allocator<char> local_71;
  Byte buffer [5];
  string local_50;
  OutputBufferedStream *local_20;
  IByteWriter *stream;
  char **argv_local;
  int argc_local;
  
  stream = (IByteWriter *)argv;
  argv_local._4_4_ = argc;
  this = (OutputBufferedStream *)operator_new(0x28);
  local_73 = 1;
  this_00 = (OutputFileStream *)operator_new(0x10);
  argv_00 = stream;
  local_72 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,"BufferedOutputStreamTest.txt",&local_71);
  BuildRelativeOutputPath(&local_50,(char **)argv_00,(string *)buffer);
  OutputFileStream::OutputFileStream(this_00,&local_50,false);
  local_72 = 0;
  OutputBufferedStream::OutputBufferedStream(this,(IByteWriterWithPosition *)this_00,2);
  local_73 = 0;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)buffer);
  std::allocator<char>::~allocator(&local_71);
  local_78 = 0x64636261;
  local_74 = 0x65;
  local_20 = this;
  (*(this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter[2])(this,&local_78,5);
  if (local_20 != (OutputBufferedStream *)0x0) {
    (*(local_20->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter[1])();
  }
  return 0;
}

Assistant:

int BufferedOutputStreamTest(int argc, char* argv[])
{
	IByteWriter* stream = new OutputBufferedStream(new OutputFileStream(
                            BuildRelativeOutputPath(argv,"BufferedOutputStreamTest.txt")),2);
	Byte buffer[5] = {'a','b','c','d','e'};

	stream->Write(buffer,5);
	delete stream;

	return 0;
}